

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableWriter(SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  IdlNamer *this_01;
  int iVar2;
  FieldDef *field;
  pointer ppFVar3;
  pointer pbVar4;
  string spacing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  require_fields;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  create_func_header;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  create_func_body;
  allocator<char> local_389;
  StructDef *local_388;
  string local_380;
  string local_360;
  FieldDef *local_340;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  pointer local_2c0;
  pointer local_2b8;
  allocator<char> local_2b0 [32];
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2b8 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2c0 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"NUMBEROFFIELDS",(allocator<char> *)&local_338);
  local_388 = struct_def;
  NumToString<unsigned_long>
            (&local_360,
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_380,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "{{ACCESS_TYPE}} static func start{{SHORT_STRUCTNAME}}(_ fbb: inout FlatBufferBuilder) -> UOffset { fbb.startTable(with: {{NUMBEROFFIELDS}}) }"
             ,(allocator<char> *)&local_380);
  CodeWriter::operator+=(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  ppFVar3 = (local_388->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_340 = (FieldDef *)0x0;
  for (; ppFVar3 !=
         (local_388->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    field = *ppFVar3;
    if (field->deprecated == false) {
      if (field->key != false) {
        local_340 = field;
      }
      if (field->presence == kRequired) {
        NumToString<unsigned_short>(&local_380,(field->value).offset);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
                   &local_380);
        std::__cxx11::string::~string((string *)&local_380);
      }
      GenTableWriterFields(this,field,&local_2d8,&local_2f8);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "{{ACCESS_TYPE}} static func end{{SHORT_STRUCTNAME}}(_ fbb: inout FlatBufferBuilder, start: UOffset) -> Offset { let end = Offset(offset: fbb.endTable(at: start))\\"
             ,(allocator<char> *)&local_380);
  CodeWriter::operator+=(this_00,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"",(allocator<char> *)&local_360);
    for (pbVar4 = local_318.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 != local_318.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      std::operator+(&local_360,pbVar4,", ");
      std::__cxx11::string::append((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"FIELDS",local_2b0);
    std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_380);
    CodeWriter::SetValue(this_00,&local_360,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"; fbb.require(table: end, fields: [{{FIELDS}}])\\",
               (allocator<char> *)&local_360);
    CodeWriter::operator+=(this_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"; return end }",(allocator<char> *)&local_380);
  CodeWriter::operator+=(this_00,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  if (local_2c0 != local_2b8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"{{ACCESS_TYPE}} static func create{{SHORT_STRUCTNAME}}(",
               (allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"_ fbb: inout FlatBufferBuilder,",(allocator<char> *)&local_380)
    ;
    CodeWriter::operator+=(this_00,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    for (pbVar4 = local_2f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 < local_2f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      std::operator+(&local_50,pbVar4,"\\");
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (pbVar4 < local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,",",(allocator<char> *)&local_380);
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",(allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    iVar2 = (this->code_).cur_ident_lvl_;
    if (iVar2 != 0) {
      (this->code_).cur_ident_lvl_ = iVar2 + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,") -> Offset {",(allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"let __start = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&fbb)",
               (allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    for (pbVar4 = local_2d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 < local_2d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
      std::__cxx11::string::string((string *)&local_90,(string *)pbVar4);
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,
               "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&fbb, start: __start)",
               (allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iVar2 = (this->code_).cur_ident_lvl_;
    if (iVar2 != 0) {
      (this->code_).cur_ident_lvl_ = iVar2 + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"}",(allocator<char> *)&local_380);
    CodeWriter::operator+=(this_00,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"",(allocator<char> *)&local_360);
  if (((local_340 != (FieldDef *)0x0) && (local_388->fixed == false)) &&
     (local_388->has_key == true)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"VOFFSET",local_2b0);
    NumToString<unsigned_short>(&local_338,(local_340->value).offset);
    CodeWriter::SetValue(this_00,&local_360,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2b0,"sort_vector_of",&local_389);
    this_01 = &this->namer_;
    (*(this_01->super_Namer)._vptr_Namer[3])(&local_338,this_01,local_2b0,local_388);
    std::operator+(&local_360,"{{ACCESS_TYPE}} static func ",&local_338);
    std::operator+(&local_210,&local_360,
                   "(offsets:[Offset], _ fbb: inout FlatBufferBuilder) -> Offset {");
    CodeWriter::operator+=(this_00,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)local_2b0);
    piVar1 = &(this->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    std::operator+(&local_230,&local_380,"var off = offsets");
    CodeWriter::operator+=(this_00,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::operator+(&local_250,&local_380,
                   "off.sort { Table.compare(Table.offset(Int32($1.o), vOffset: {{VOFFSET}}, fbb: fbb.buffer), Table.offset(Int32($0.o), vOffset: {{VOFFSET}}, fbb: fbb.buffer), fbb: fbb.buffer) < 0 } "
                  );
    CodeWriter::operator+=(this_00,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::operator+(&local_270,&local_380,"return fbb.createVector(ofOffsets: off)");
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    iVar2 = (this->code_).cur_ident_lvl_;
    if (iVar2 != 0) {
      (this->code_).cur_ident_lvl_ = iVar2 + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"}",(allocator<char> *)&local_360);
    CodeWriter::operator+=(this_00,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    IdlNamer::NamespacedType_abi_cxx11_(&local_360,this_01,&local_388->super_Definition);
    GenLookup(this,local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
  }
  std::__cxx11::string::~string((string *)&local_380);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return;
}

Assistant:

void GenTableWriter(const StructDef &struct_def) {
    flatbuffers::FieldDef *key_field = nullptr;
    std::vector<std::string> require_fields;
    std::vector<std::string> create_func_body;
    std::vector<std::string> create_func_header;
    const auto should_generate_create = struct_def.fields.vec.size() != 0;

    code_.SetValue("NUMBEROFFIELDS", NumToString(struct_def.fields.vec.size()));
    code_ +=
        "{{ACCESS_TYPE}} static func start{{SHORT_STRUCTNAME}}(_ fbb: inout "
        "FlatBufferBuilder) -> "
        "UOffset { fbb.startTable(with: {{NUMBEROFFIELDS}}) }";

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      if (field.key) key_field = &field;
      if (field.IsRequired())
        require_fields.push_back(NumToString(field.value.offset));

      GenTableWriterFields(field, &create_func_body, &create_func_header);
    }
    code_ +=
        "{{ACCESS_TYPE}} static func end{{SHORT_STRUCTNAME}}(_ fbb: inout "
        "FlatBufferBuilder, "
        "start: "
        "UOffset) -> Offset { let end = Offset(offset: "
        "fbb.endTable(at: start))\\";
    if (require_fields.capacity() != 0) {
      std::string fields = "";
      for (auto it = require_fields.begin(); it != require_fields.end(); ++it)
        fields += *it + ", ";
      code_.SetValue("FIELDS", fields.substr(0, fields.size() - 2));
      code_ += "; fbb.require(table: end, fields: [{{FIELDS}}])\\";
    }
    code_ += "; return end }";

    if (should_generate_create) {
      code_ += "{{ACCESS_TYPE}} static func create{{SHORT_STRUCTNAME}}(";
      Indent();
      code_ += "_ fbb: inout FlatBufferBuilder,";
      for (auto it = create_func_header.begin(); it < create_func_header.end();
           ++it) {
        code_ += *it + "\\";
        if (it < create_func_header.end() - 1) code_ += ",";
      }
      code_ += "";
      Outdent();
      code_ += ") -> Offset {";
      Indent();
      code_ += "let __start = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&fbb)";
      for (auto it = create_func_body.begin(); it < create_func_body.end();
           ++it) {
        code_ += *it;
      }
      code_ +=
          "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&fbb, start: __start)";
      Outdent();
      code_ += "}";
    }

    std::string spacing = "";

    if (key_field != nullptr && !struct_def.fixed && struct_def.has_key) {
      code_.SetValue("VOFFSET", NumToString(key_field->value.offset));

      code_ += "{{ACCESS_TYPE}} static func " +
               namer_.Method("sort_vector_of", struct_def) +
               "(offsets:[Offset], "
               "_ fbb: inout FlatBufferBuilder) -> Offset {";
      Indent();
      code_ += spacing + "var off = offsets";
      code_ +=
          spacing +
          "off.sort { Table.compare(Table.offset(Int32($1.o), vOffset: "
          "{{VOFFSET}}, fbb: fbb.buffer), Table.offset(Int32($0.o), vOffset: "
          "{{VOFFSET}}, fbb: fbb.buffer), fbb: fbb.buffer) < 0 } ";
      code_ += spacing + "return fbb.createVector(ofOffsets: off)";
      Outdent();
      code_ += "}";
      GenLookup(*key_field, namer_.NamespacedType(struct_def));
    }
  }